

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDF::getUncompressedObject
          (QPDF *this,QPDFObjectHandle *obj,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *object_stream_data)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  size_type sVar3;
  const_iterator cVar4;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  QPDFObjectHandle QVar6;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  local_28 = in_RAX;
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)object_stream_data);
  if (!bVar1) {
    iVar2 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)object_stream_data);
    local_28 = CONCAT44(iVar2,(key_type)local_28);
    sVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )in_RCX,(key_type *)((long)&local_28 + 4));
    if (sVar3 != 0) {
      iVar2 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)object_stream_data);
      local_28 = CONCAT44(local_28._4_4_,iVar2);
      cVar4 = std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::find(in_RCX,(key_type *)&local_28);
      QVar6 = getObject(this,(int)obj,*(int *)&cVar4._M_node[1].field_0x4);
      _Var5._M_pi = QVar6.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_001d6ce8;
    }
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object_stream_data);
  _Var5._M_pi = extraout_RDX;
LAB_001d6ce8:
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getUncompressedObject(QPDFObjectHandle& obj, std::map<int, int> const& object_stream_data)
{
    if (obj.isNull() || (object_stream_data.count(obj.getObjectID()) == 0)) {
        return obj;
    } else {
        int repl = (*(object_stream_data.find(obj.getObjectID()))).second;
        return getObject(repl, 0);
    }
}